

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O3

BOOL __thiscall
Js::TypedArray<int,_false,_false>::DirectSetItemAtRange
          (TypedArray<int,_false,_false> *this,int32 start,uint32 length,int typedValue)

{
  uint uVar1;
  Type puVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  ulong uVar7;
  BOOL BVar8;
  ulong uVar9;
  
  BVar5 = CrossSite::IsCrossSiteObjectTyped<Js::TypedArray<int,false,false>>(this);
  BVar8 = 0;
  if (BVar5 == 0) {
    if (((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached == true)
    {
      JavascriptError::ThrowTypeError
                ((((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                     super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
    }
    if (start < 0) {
      if ((long)((long)start + (ulong)length) < 0) {
        return 1;
      }
      length = length + start;
      start = 0;
    }
    uVar1 = (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
    BVar8 = 1;
    if ((uint)start <= uVar1 && uVar1 - start != 0) {
      if (CARRY4(start,length)) {
        ::Math::DefaultOverflowPolicy();
      }
      if (uVar1 < start + length) {
        length = uVar1 - start;
      }
      uVar9 = (ulong)length;
      puVar2 = (this->super_TypedArrayBase).buffer;
      if (typedValue == 0) {
        if (uVar9 * 4 < uVar9) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                      ,0x1ab,"(byteSize >= newLength)","byteSize >= newLength");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar6 = 0;
        }
        memset(puVar2 + (ulong)(uint)start * 4,0,uVar9 * 4);
      }
      else if (length != 0) {
        uVar7 = 0;
        do {
          *(int *)(puVar2 + (ulong)(uint)(start + (int)uVar7) * 4) = typedValue;
          uVar7 = uVar7 + 1;
        } while (uVar7 < uVar9);
      }
    }
  }
  return BVar8;
}

Assistant:

inline BOOL DirectSetItemAtRange(__in int32 start, __in uint32 length, __in TypeName typedValue)
        {
            if (CrossSite::IsCrossSiteObjectTyped(this))
            {
                return false;
            }

            if (this->IsDetachedBuffer()) // 9.4.5.9 IntegerIndexedElementSet
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }
            uint32 newStart = start, newLength = length;

            if (start < 0)
            {
                if ((int64)(length) + start < 0)
                {
                    // nothing to do, all index are no-op
                    return true;
                }
                newStart = 0;
                // fixup the length with the change
                newLength += start;
            }
            if (newStart >= GetLength())
            {
                // If we want to start copying past the length of the array, all index are no-op
                return true;
            }
            if (UInt32Math::Add(newStart, newLength) > GetLength())
            {
                newLength = GetLength() - newStart;
            }

            TypeName* typedBuffer = (TypeName*)buffer;

            if (typedValue == 0 || sizeof(TypeName) == 1)
            {
                const size_t byteSize = sizeof(TypeName) * newLength;
                Assert(byteSize >= newLength); // check for overflow
                memset(typedBuffer + newStart, (int)typedValue, byteSize);
            }
            else
            {
                for (uint32 i = 0; i < newLength; i++)
                {
                    typedBuffer[newStart + i] = typedValue;
                }
            }

            return TRUE;
        }